

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultisampleCase::MultisampleCase
          (MultisampleCase *this,Context *context,char *name,char *desc)

{
  deUint32 seed;
  char *desc_local;
  char *name_local;
  Context *context_local;
  MultisampleCase *this_local;
  
  gles2::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0327bcd0;
  this->m_numSamples = 0;
  this->m_viewportSize = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_attrPositionLoc = -1;
  this->m_attrColorLoc = -1;
  this->m_viewportX = 0;
  this->m_viewportY = 0;
  seed = deStringHash(name);
  de::Random::Random(&this->m_rnd,seed);
  return;
}

Assistant:

MultisampleCase::MultisampleCase (Context& context, const char* name, const char* desc)
	: TestCase			(context, name, desc)
	, m_numSamples		(0)
	, m_viewportSize	(0)
	, m_program			(DE_NULL)
	, m_attrPositionLoc	(-1)
	, m_attrColorLoc	(-1)
	, m_viewportX		(0)
	, m_viewportY		(0)
	, m_rnd				(deStringHash(name))
{
}